

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

void __thiscall Rml::DataViewRml::DataViewRml(DataViewRml *this,Element *element)

{
  String local_38;
  Element *local_18;
  Element *element_local;
  DataViewRml *this_local;
  
  local_18 = element;
  element_local = (Element *)this;
  ::std::__cxx11::string::string((string *)&local_38);
  DataViewCommon::DataViewCommon(&this->super_DataViewCommon,element,&local_38,0);
  ::std::__cxx11::string::~string((string *)&local_38);
  (this->super_DataViewCommon).super_DataView.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewRml_00815588;
  ::std::__cxx11::string::string((string *)&this->previous_rml);
  return;
}

Assistant:

DataViewRml::DataViewRml(Element* element) : DataViewCommon(element) {}